

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O1

int Abc_NodeMakeSCCFree(Abc_Obj_t *pNode)

{
  size_t __n;
  uint uVar1;
  long lVar2;
  int iVar3;
  char *__src;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  undefined1 *__dest;
  
  __src = (char *)(pNode->field_5).pData;
  if (*__src != '\0') {
    uVar1 = (pNode->vFanins).nSize;
    lVar2 = (long)(int)uVar1;
    __n = lVar2 + 3;
    iVar3 = 0;
    pcVar4 = __src;
    do {
      cVar6 = pcVar4[lVar2 + 3];
      if (cVar6 != '\0') {
        pcVar5 = pcVar4 + lVar2 + 3;
        do {
          if ((cVar6 != 'z') && (*pcVar4 != 'z')) {
            if ((int)uVar1 < 1) {
              uVar7 = 3;
            }
            else {
              uVar7 = 1;
              uVar8 = 0;
              do {
                cVar6 = pcVar4[uVar8];
                if (cVar6 != pcVar5[uVar8]) {
                  if ((cVar6 != '-') && (uVar7 = 0, pcVar5[uVar8] != '-')) goto LAB_001c9691;
                  if (cVar6 == '-') {
                    uVar7 = 0;
                    goto LAB_001c9691;
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar1 != uVar8);
              uVar7 = uVar7 | 2;
            }
LAB_001c9691:
            iVar3 = (iVar3 + 1) - (uint)(uVar7 == 0);
            pcVar9 = pcVar5;
            if (((uVar7 & 1) != 0) || (pcVar9 = pcVar4, uVar7 != 0)) {
              *pcVar9 = 'z';
            }
          }
          cVar6 = pcVar5[__n];
          pcVar5 = pcVar5 + __n;
        } while (cVar6 != '\0');
      }
      pcVar5 = pcVar4 + __n;
      pcVar4 = pcVar4 + __n;
    } while (*pcVar5 != '\0');
    if (iVar3 != 0) {
      __dest = (undefined1 *)(pNode->field_5).pData;
      do {
        if (*__src != 'z') {
          if (*__src == '\0') {
            *__dest = 0;
            return 1;
          }
          memcpy(__dest,__src,__n);
          __dest = __dest + __n;
        }
        __src = __src + (int)(uVar1 + 3);
      } while( true );
    }
  }
  return 0;
}

Assistant:

int Abc_NodeMakeSCCFree( Abc_Obj_t * pNode )
{
    char * pSop = (char *)pNode->pData;
    char * pCube, * pCube2, * pSopNew;
    int nVars = Abc_ObjFaninNum(pNode);
    int Status, nCount = 0;
    Abc_SopForEachCubePair( pSop, nVars, pCube, pCube2 )
    {
        if ( pCube[0] == 'z' || pCube2[0] == 'z' )
            continue;
        Status = Abc_CubeContain( pCube, pCube2, nVars );
        nCount += (int)(Status > 0);
        if ( Status & 1 )
            pCube2[0] = 'z';
        else if ( Status & 2 )
            pCube[0] = 'z';
    }
    if ( nCount == 0 )
        return 0;
    // create new cover
    pSopNew = (char *)pNode->pData;
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        if ( pCube[0] == 'z' )
            continue;
        memcpy( pSopNew, pCube, nVars + 3 );
        pSopNew += nVars + 3;
    }
    *pSopNew = 0;
    return 1;
}